

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.h
# Opt level: O1

void __thiscall CP::queue<int>::print(queue<int> *this)

{
  ostream *poVar1;
  ulong uVar2;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Size ",5);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,": ",2);
  if (this->mSize != 0) {
    uVar2 = 0;
    do {
      poVar1 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)&std::cout,this->mData[(this->mFront + uVar2) % this->mCap]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
      uVar2 = uVar2 + 1;
    } while (uVar2 < this->mSize);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
  std::ostream::put('p');
  std::ostream::flush();
  return;
}

Assistant:

void print() {
      std::cout << "Size " << mSize << ": ";
      for (size_t i = 0;i < mSize;i++) {
        std::cout << mData[(mFront+i) % mCap] << " ";
      }
      std::cout << std::endl;
    }